

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O0

void rxa2_free_memory(argon2_context *context,uint8_t *memory,size_t num,size_t size)

{
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t memory_size;
  
  rxa2_clear_internal_memory(in_RSI,in_RDX * in_RCX);
  if (*(long *)(in_RDI + 0x68) == 0) {
    free(in_RSI);
  }
  else {
    (**(code **)(in_RDI + 0x68))(in_RSI,in_RDX * in_RCX);
  }
  return;
}

Assistant:

void rxa2_free_memory(const argon2_context *context, uint8_t *memory,
	size_t num, size_t size) {
	size_t memory_size = num * size;
	rxa2_clear_internal_memory(memory, memory_size);
	if (context->free_cbk) {
		(context->free_cbk)(memory, memory_size);
	}
	else {
		free(memory);
	}
}